

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1450.cpp
# Opt level: O1

int main(void)

{
  pointer peVar1;
  istream *piVar2;
  void *__s;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  int f;
  int s;
  int m;
  int w;
  int b;
  int n;
  int local_50;
  e local_4c;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_34);
  std::istream::operator>>(piVar2,(int *)&local_40);
  __s = operator_new(0x7f8);
  memset(__s,0xff,0x7f8);
  if (0 < (int)local_40) {
    iVar5 = 0;
    do {
      piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_50);
      piVar2 = (istream *)std::istream::operator>>(piVar2,&local_38);
      std::istream::operator>>(piVar2,&local_3c);
      peVar1 = v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      local_4c.a = local_50 + -1;
      local_4c.b = local_38 + -1;
      local_4c.w = local_3c;
      if (v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish ==
          v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<e,_std::allocator<e>_>::_M_realloc_insert<e>
                  (&v,(iterator)
                      v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
                      _M_finish,&local_4c);
      }
      else {
        (v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish)->w =
             local_3c;
        peVar1->a = local_4c.a;
        peVar1->b = local_4c.b;
        v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish =
             v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish +
             1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < (int)local_40);
  }
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_4c.a);
  std::istream::operator>>(piVar2,&local_50);
  lVar4 = (long)local_4c.a;
  local_4c.a = local_4c.a + -1;
  lVar3 = (long)local_50;
  local_50 = local_50 + -1;
  *(undefined4 *)((long)__s + lVar4 * 4 + -4) = 0;
  peVar1 = v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start;
  if (1 < local_34) {
    iVar5 = 0;
    do {
      if (0 < (int)local_40) {
        lVar4 = 0;
        do {
          iVar6 = *(int *)((long)__s + (long)*(int *)((long)&peVar1->a + lVar4) * 4);
          if (iVar6 != -1) {
            lVar7 = (long)*(int *)((long)&peVar1->b + lVar4);
            iVar6 = iVar6 + *(int *)((long)&peVar1->w + lVar4);
            if (*(int *)((long)__s + lVar7 * 4) < iVar6) {
              *(int *)((long)__s + lVar7 * 4) = iVar6;
            }
          }
          lVar4 = lVar4 + 0xc;
        } while ((ulong)local_40 * 0xc != lVar4);
      }
      bVar8 = iVar5 != local_34 + -2;
      iVar5 = iVar5 + 1;
    } while (bVar8);
  }
  iVar5 = *(int *)((long)__s + lVar3 * 4 + -4);
  if (iVar5 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No solution",0xb);
  }
  else {
    std::ostream::operator<<((ostream *)&std::cout,iVar5);
  }
  operator_delete(__s,0x7f8);
  return 0;
}

Assistant:

int main() {
    int n, m;
    std::cin >> n >> m;
    std::vector<int> res(510, -1);
    for (int i = 0; i < m; ++i) {
        int a, b, w;
        std::cin >> a >> b >> w;
        v.push_back({a - 1, b - 1, w});
    }
    int s, f;
    std::cin >> s >> f;
    s--;
    f--;
    res[s] = 0;

    for (int i = 0; i < n - 1; ++i) {
        for (int j = 0; j < m; ++j) {
            if (res[v[j].a] != -1 && res[v[j].b] < res[v[j].a] + v[j].w) {
                res[v[j].b] = res[v[j].a] + v[j].w;
            }
        }
    }
    if (res[f] != -1) {
        std::cout << res[f];
    } else {
        std::cout << "No solution";
    }

    return 0;
}